

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
Tools::stringvec_to_doublevec
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stringvec)

{
  int iVar1;
  pointer pbVar2;
  char *__nptr;
  int *piVar3;
  invalid_argument *this;
  pointer pdVar4;
  pointer __rhs;
  double dVar5;
  undefined1 auVar6 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,
             (long)(stringvec->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(stringvec->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_50);
  __rhs = (stringvec->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (stringvec->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs != pbVar2) {
    pdVar4 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = __errno_location();
    do {
      __nptr = (__rhs->_M_dataplus)._M_p;
      iVar1 = *piVar3;
      *piVar3 = 0;
      dVar5 = strtod(__nptr,(char **)&local_50);
      if (local_50._M_dataplus._M_p == __nptr) {
        std::__throw_invalid_argument("stod");
LAB_0012f461:
        auVar6 = std::__throw_out_of_range("stod");
        if (*piVar3 == 0) {
          *piVar3 = iVar1;
        }
        if (auVar6._8_4_ != 1) {
          pdVar4 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (pdVar4 != (pointer)0x0) {
            operator_delete(pdVar4);
          }
          _Unwind_Resume(auVar6._0_8_);
        }
        __cxa_begin_catch(auVar6._0_8_);
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&local_50,"invalid argument: ",__rhs);
        std::invalid_argument::invalid_argument(this,(string *)&local_50);
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      if (*piVar3 == 0) {
        *piVar3 = iVar1;
      }
      else if (*piVar3 == 0x22) goto LAB_0012f461;
      *pdVar4 = dVar5;
      __rhs = __rhs + 1;
      pdVar4 = pdVar4 + 1;
    } while (__rhs != pbVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> Tools::stringvec_to_doublevec(std::vector<std::string> stringvec) {
    std::vector<double> doublevec(stringvec.size());
    std::transform(stringvec.begin(), stringvec.end(), doublevec.begin(), [](const std::string &val) {
        try {
            return std::stod(val);
        }
        catch (const std::invalid_argument &ia) {
            throw std::invalid_argument("invalid argument: " + val);
        }
    });
    return doublevec;
}